

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

Expression * __thiscall wasm::TranslateToFuzzReader::makeStringConst(TranslateToFuzzReader *this)

{
  Random *this_00;
  bool bVar1;
  char cVar2;
  char cVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  Expression *pEVar6;
  uint32_t uVar7;
  long lVar8;
  char *pcVar9;
  ulong uVar10;
  bool bVar11;
  Expression EVar12;
  stringstream local_368 [8];
  stringstream wtf8;
  ostream local_358 [112];
  ios_base aiStack_2e8 [264];
  long *local_1e0;
  stringstream wtf16;
  undefined4 uStack_1d4;
  long local_1d0 [14];
  ios_base aiStack_160 [264];
  TranslateToFuzzReader *local_58;
  long *local_50;
  undefined8 local_48;
  long local_40 [2];
  
  std::__cxx11::stringstream::stringstream(local_368);
  this_00 = &this->random;
  local_58 = this;
  uVar4 = Random::upTo(this_00,4);
  if (uVar4 != 0) {
    bVar11 = false;
    uVar10 = 0;
    do {
      uVar5 = Random::upTo(this_00,6);
      switch(uVar5) {
      case 0:
        uVar5 = Random::upTo(this_00,0x400);
        cVar3 = '\x01';
        if (9 < uVar5) {
          uVar7 = uVar5;
          cVar2 = '\x04';
          do {
            cVar3 = cVar2;
            if (uVar7 < 100) {
              cVar3 = cVar3 + -2;
              goto LAB_00135857;
            }
            if (uVar7 < 1000) {
              cVar3 = cVar3 + -1;
              goto LAB_00135857;
            }
            if (uVar7 < 10000) goto LAB_00135857;
            bVar11 = 99999 < uVar7;
            uVar7 = uVar7 / 10000;
            cVar2 = cVar3 + '\x04';
          } while (bVar11);
          cVar3 = cVar3 + '\x01';
        }
LAB_00135857:
        local_1e0 = local_1d0;
        std::__cxx11::string::_M_construct((ulong)&local_1e0,cVar3);
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_1e0,_wtf16,uVar5);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_358,(char *)local_1e0,CONCAT44(uStack_1d4,_wtf16));
        if (local_1e0 != local_1d0) {
          operator_delete(local_1e0,local_1d0[0] + 1);
        }
        goto switchD_00135769_default;
      case 1:
        lVar8 = 2;
        pcVar9 = anon_var_dwarf_b855c;
        break;
      case 2:
        lVar8 = 3;
        pcVar9 = anon_var_dwarf_b8577;
        break;
      case 3:
        lVar8 = 4;
        pcVar9 = anon_var_dwarf_b8584;
        break;
      case 4:
        bVar11 = true;
        std::__ostream_insert<char,std::char_traits<char>>(local_358,anon_var_dwarf_b8591,3);
        goto LAB_00135842;
      case 5:
        lVar8 = 3;
        pcVar9 = anon_var_dwarf_b859e;
        bVar1 = !bVar11;
        bVar11 = true;
        if (bVar1) break;
        goto LAB_00135842;
      default:
        goto switchD_00135769_default;
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_358,pcVar9,lVar8);
switchD_00135769_default:
      bVar11 = false;
LAB_00135842:
      uVar10 = uVar10 + 1;
    } while (uVar10 != uVar4);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1e0);
  std::__cxx11::stringbuf::str();
  wasm::String::convertWTF8ToWTF16(local_1d0,local_48,local_50);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  std::__cxx11::stringbuf::str();
  EVar12 = (Expression)wasm::IString::interned(local_48,local_50,0);
  pEVar6 = (Expression *)
           MixedArena::allocSpace((MixedArena *)((local_58->builder).wasm + 0x200),0x20,8);
  pEVar6->_id = StringConstId;
  (pEVar6->type).id = 0;
  pEVar6[1] = EVar12;
  wasm::StringConst::finalize();
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1e0);
  std::ios_base::~ios_base(aiStack_160);
  std::__cxx11::stringstream::~stringstream(local_368);
  std::ios_base::~ios_base(aiStack_2e8);
  return pEVar6;
}

Assistant:

Expression* TranslateToFuzzReader::makeStringConst() {
  // Construct an interesting WTF-8 string from parts and use string.const.
  std::stringstream wtf8;
  bool lastWasLeadingSurrogate = false;
  for (size_t i = 0, end = upTo(4); i < end; ++i) {
    switch (upTo(6)) {
      case 0:
        // A simple ascii string.
        wtf8 << std::to_string(upTo(1024));
        break;
      case 1:
        // '£'
        wtf8 << "\xC2\xA3";
        break;
      case 2:
        // '€'
        wtf8 << "\xE2\x82\xAC";
        break;
      case 3:
        // '𐍈'
        wtf8 << "\xF0\x90\x8D\x88";
        break;
      case 4:
        // The leading surrogate in '𐍈'
        wtf8 << "\xED\xA0\x80";
        lastWasLeadingSurrogate = true;
        continue;
      case 5:
        if (lastWasLeadingSurrogate) {
          // Avoid invalid WTF-8.
          continue;
        }
        // The trailing surrogate in '𐍈'
        wtf8 << "\xED\xBD\x88";
        break;
    }
    lastWasLeadingSurrogate = false;
  }
  std::stringstream wtf16;
  // TODO: Use wtf16.view() once we have C++20.
  String::convertWTF8ToWTF16(wtf16, wtf8.str());
  return builder.makeStringConst(wtf16.str());
}